

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptExceptionObject.cpp
# Opt level: O3

void Js::JavascriptExceptionObject::Remove(Type *head,JavascriptExceptionObject *item)

{
  JavascriptExceptionObject *pJVar1;
  code *pcVar2;
  bool bVar3;
  JavascriptExceptionObject *pJVar4;
  undefined4 *puVar5;
  
  pJVar1 = head->ptr;
  if (pJVar1 == (JavascriptExceptionObject *)0x0) {
LAB_00a9466f:
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptExceptionObject.cpp"
                                ,0xfe,"(false)","false");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  else {
    if (pJVar1 != item) {
      do {
        pJVar4 = pJVar1;
        pJVar1 = (pJVar4->next).ptr;
        if (pJVar1 == (JavascriptExceptionObject *)0x0) goto LAB_00a9466f;
      } while (pJVar1 != item);
      head = &pJVar4->next;
    }
    pJVar1 = (item->next).ptr;
    Memory::Recycler::WBSetBit((char *)head);
    head->ptr = pJVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(head);
    (item->next).ptr = (JavascriptExceptionObject *)0x0;
  }
  return;
}

Assistant:

void JavascriptExceptionObject::Remove(
        Field(JavascriptExceptionObject*)* head, JavascriptExceptionObject* item)
    {
        // Typically Insert/Remove happens in reversed order and item should be
        // the front one. Loop the whole list to prevent unexpected order messup.
        for (auto p = head; *p; p = &(*p)->next)
        {
            if (*p == item)
            {
                *p = item->next;
                item->next = nullptr;
                return;
            }
        }

        Assert(false);  // item not in list unexpected
    }